

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O1

FT_Error cff_ps_get_font_info(CFF_Face face,PS_FontInfoRec *afont_info)

{
  uint uVar1;
  void *pvVar2;
  FT_String *pFVar3;
  FT_String *pFVar4;
  FT_String *pFVar5;
  FT_String *pFVar6;
  FT_Long FVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  FT_Error error;
  FT_Error local_2c;
  
  pvVar2 = (face->extra).data;
  local_2c = 0;
  if (pvVar2 == (void *)0x0) {
    return 0;
  }
  if (*(long *)((long)pvVar2 + 0x1370) != 0) goto LAB_001405db;
  puVar8 = (undefined8 *)ft_mem_alloc((face->root).memory,0x38,&local_2c);
  if (local_2c != 0) {
    return local_2c;
  }
  uVar1 = *(uint *)((long)pvVar2 + 0x668);
  if (uVar1 == 0xffff) {
LAB_00140641:
    uVar9 = 0;
  }
  else if (uVar1 < 0x187) {
    if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_00140641;
    uVar9 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
  }
  else {
    if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_00140641;
    uVar9 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
  }
  *puVar8 = uVar9;
  uVar1 = *(uint *)((long)pvVar2 + 0x66c);
  if (uVar1 == 0xffff) {
LAB_0014065a:
    uVar9 = 0;
  }
  else if (uVar1 < 0x187) {
    if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_0014065a;
    uVar9 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
  }
  else {
    if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_0014065a;
    uVar9 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
  }
  puVar8[1] = uVar9;
  uVar1 = *(uint *)((long)pvVar2 + 0x674);
  if (uVar1 == 0xffff) {
LAB_00140674:
    uVar9 = 0;
  }
  else if (uVar1 < 0x187) {
    if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_00140674;
    uVar9 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
  }
  else {
    if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_00140674;
    uVar9 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
  }
  puVar8[2] = uVar9;
  uVar1 = *(uint *)((long)pvVar2 + 0x678);
  if (uVar1 == 0xffff) {
LAB_0014068e:
    uVar9 = 0;
  }
  else if (uVar1 < 0x187) {
    if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_0014068e;
    uVar9 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
  }
  else {
    if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_0014068e;
    uVar9 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
  }
  puVar8[3] = uVar9;
  uVar1 = *(uint *)((long)pvVar2 + 0x67c);
  if (uVar1 == 0xffff) {
LAB_001406a8:
    uVar9 = 0;
  }
  else if (uVar1 < 0x187) {
    if (*(long *)((long)pvVar2 + 0x1360) == 0) goto LAB_001406a8;
    uVar9 = (**(code **)(*(long *)((long)pvVar2 + 0x1360) + 0x28))();
  }
  else {
    if (*(uint *)((long)pvVar2 + 0x648) <= uVar1 - 0x187) goto LAB_001406a8;
    uVar9 = *(undefined8 *)(*(long *)((long)pvVar2 + 0x650) + (ulong)(uVar1 - 0x187) * 8);
  }
  puVar8[4] = uVar9;
  puVar8[5] = *(undefined8 *)((long)pvVar2 + 0x688);
  *(undefined1 *)(puVar8 + 6) = *(undefined1 *)((long)pvVar2 + 0x680);
  *(undefined2 *)((long)puVar8 + 0x32) = *(undefined2 *)((long)pvVar2 + 0x690);
  *(undefined2 *)((long)puVar8 + 0x34) = *(undefined2 *)((long)pvVar2 + 0x698);
  *(undefined8 **)((long)pvVar2 + 0x1370) = puVar8;
LAB_001405db:
  puVar8 = *(undefined8 **)((long)pvVar2 + 0x1370);
  uVar9 = puVar8[6];
  afont_info->is_fixed_pitch = (char)uVar9;
  afont_info->field_0x31 = (char)((ulong)uVar9 >> 8);
  afont_info->underline_position = (short)((ulong)uVar9 >> 0x10);
  afont_info->underline_thickness = (short)((ulong)uVar9 >> 0x20);
  *(short *)&afont_info->field_0x36 = (short)((ulong)uVar9 >> 0x30);
  pFVar3 = (FT_String *)*puVar8;
  pFVar4 = (FT_String *)puVar8[1];
  pFVar5 = (FT_String *)puVar8[2];
  pFVar6 = (FT_String *)puVar8[3];
  FVar7 = puVar8[5];
  afont_info->weight = (FT_String *)puVar8[4];
  afont_info->italic_angle = FVar7;
  afont_info->full_name = pFVar5;
  afont_info->family_name = pFVar6;
  afont_info->version = pFVar3;
  afont_info->notice = pFVar4;
  return local_2c;
}

Assistant:

static FT_Error
  cff_ps_get_font_info( CFF_Face         face,
                        PS_FontInfoRec*  afont_info )
  {
    CFF_Font  cff   = (CFF_Font)face->extra.data;
    FT_Error  error = FT_Err_Ok;


    if ( cff && !cff->font_info )
    {
      CFF_FontRecDict  dict      = &cff->top_font.font_dict;
      PS_FontInfoRec  *font_info = NULL;
      FT_Memory        memory    = face->root.memory;


      if ( FT_ALLOC( font_info, sizeof ( *font_info ) ) )
        goto Fail;

      font_info->version     = cff_index_get_sid_string( cff,
                                                         dict->version );
      font_info->notice      = cff_index_get_sid_string( cff,
                                                         dict->notice );
      font_info->full_name   = cff_index_get_sid_string( cff,
                                                         dict->full_name );
      font_info->family_name = cff_index_get_sid_string( cff,
                                                         dict->family_name );
      font_info->weight      = cff_index_get_sid_string( cff,
                                                         dict->weight );
      font_info->italic_angle        = dict->italic_angle;
      font_info->is_fixed_pitch      = dict->is_fixed_pitch;
      font_info->underline_position  = (FT_Short)dict->underline_position;
      font_info->underline_thickness = (FT_UShort)dict->underline_thickness;

      cff->font_info = font_info;
    }

    if ( cff )
      *afont_info = *cff->font_info;

  Fail:
    return error;
  }